

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Tags.cpp
# Opt level: O1

void RenX::replace_tag(string *fmt,string_view tag,string_view internal_tag)

{
  size_type __pos;
  
  while( true ) {
    __pos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (fmt,tag._M_str,0,tag._M_len);
    if (__pos == 0xffffffffffffffff) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              (fmt,__pos,tag._M_len,internal_tag._M_str,internal_tag._M_len);
  }
  return;
}

Assistant:

void RenX::replace_tag(std::string& fmt, std::string_view tag, std::string_view internal_tag) {
	// Search for tag
	size_t tag_pos = fmt.find(tag);
	if (tag_pos == std::string::npos) {
		return;
	}

	// Replace the tag
	fmt.replace(tag_pos, tag.size(), internal_tag);

	// Recurse for any further instances; less efficient than old replace() but should be rare anyways
	replace_tag(fmt, tag, internal_tag);
}